

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<kj::File,_std::nullptr_t> kj::newMemfdFile(uint flags)

{
  int osErrorNumber;
  void *pvVar1;
  File *extraout_RDX;
  undefined4 in_register_0000003c;
  Own<kj::File,_std::nullptr_t> OVar2;
  Fault local_38;
  Fault f;
  SyscallResult local_20;
  undefined1 local_1c [4];
  SyscallResult _kjSyscallResult;
  int _kj_fd;
  uint flags_local;
  
  f.exception = (Exception *)local_1c;
  local_20 = _::Debug::syscall<kj::newMemfdFile(unsigned_int)::__0>
                       ((anon_class_16_2_307eeb53 *)&f,false);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_20);
  if (pvVar1 != (void *)0x0) {
    OwnFd::OwnFd((OwnFd *)&_kjSyscallResult,(int)local_1c);
    newDiskFile((kj *)CONCAT44(in_register_0000003c,flags),(OwnFd *)&_kjSyscallResult);
    OwnFd::~OwnFd((OwnFd *)&_kjSyscallResult);
    OVar2.ptr = extraout_RDX;
    OVar2.disposer = (Disposer *)CONCAT44(in_register_0000003c,flags);
    return OVar2;
  }
  osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_20);
  _::Debug::Fault::Fault
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x732,osErrorNumber,"_kj_fd = memfd_create(\"kj-memfd\", flags | 1U)","");
  _::Debug::Fault::fatal(&local_38);
}

Assistant:

Own<File> newMemfdFile(uint flags) {
  return newDiskFile(KJ_SYSCALL_FD(memfd_create("kj-memfd", flags | MFD_CLOEXEC)));
}